

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abc.c
# Opt level: O0

int Abc_CommandAbc9Lcorr(Abc_Frame_t *pAbc,int argc,char **argv)

{
  int iVar1;
  Gia_Man_t *pGVar2;
  char *pcVar3;
  int c;
  Gia_Man_t *pTemp;
  Cec_ParCor_t *pPars;
  Cec_ParCor_t Pars;
  char **argv_local;
  int argc_local;
  Abc_Frame_t *pAbc_local;
  
  Pars.pFunc = argv;
  Cec_ManCorSetDefaultParams((Cec_ParCor_t *)&pPars);
  Pars.nLevelMax = 1;
  Extra_UtilGetoptReset();
LAB_002502e9:
  do {
    iVar1 = Extra_UtilGetopt(argc,(char **)Pars.pFunc,"FCPrcvwh");
    if (iVar1 == -1) {
      if (pAbc->pGia == (Gia_Man_t *)0x0) {
        Abc_Print(-1,"Abc_CommandAbc9Lcorr(): There is no AIG.\n");
        return 1;
      }
      iVar1 = Gia_ManBoxNum(pAbc->pGia);
      if ((iVar1 != 0) && (iVar1 = Gia_ManRegBoxNum(pAbc->pGia), iVar1 != 0)) {
        if (pAbc->pGia->pAigExtra == (Gia_Man_t *)0x0) {
          printf("Timing manager is given but there is no GIA of boxes.\n");
          return 0;
        }
        pGVar2 = Gia_ManSweepWithBoxes
                           (pAbc->pGia,(void *)0x0,(Cec_ParCor_t *)&pPars,0,0,Pars.fVerboseFlops,
                            Pars.fUseSmartCnf);
        Abc_FrameUpdateGia(pAbc,pGVar2);
        return 0;
      }
      iVar1 = Gia_ManRegNum(pAbc->pGia);
      if (iVar1 == 0) {
        Abc_Print(-1,"The network is combinational.\n");
        return 0;
      }
      pGVar2 = Cec_ManLSCorrespondence(pAbc->pGia,(Cec_ParCor_t *)&pPars);
      Abc_FrameUpdateGia(pAbc,pGVar2);
      return 0;
    }
    switch(iVar1) {
    case 0x43:
      if (argc <= globalUtilOptind) {
        Abc_Print(-1,"Command line switch \"-C\" should be followed by an integer.\n");
        goto LAB_00250619;
      }
      Pars.nFrames = atoi(*(char **)((long)Pars.pFunc + (long)globalUtilOptind * 8));
      iVar1 = Pars.nFrames;
      break;
    default:
      goto LAB_00250619;
    case 0x46:
      if (argc <= globalUtilOptind) {
        Abc_Print(-1,"Command line switch \"-F\" should be followed by an integer.\n");
        goto LAB_00250619;
      }
      Pars.nWords = atoi(*(char **)((long)Pars.pFunc + (long)globalUtilOptind * 8));
      iVar1 = Pars.nWords;
      break;
    case 0x50:
      if (argc <= globalUtilOptind) {
        Abc_Print(-1,"Command line switch \"-P\" should be followed by an integer.\n");
        goto LAB_00250619;
      }
      Pars.nRounds = atoi(*(char **)((long)Pars.pFunc + (long)globalUtilOptind * 8));
      iVar1 = Pars.nRounds;
      break;
    case 99:
      Pars.fUseRings = Pars.fUseRings ^ 1;
      goto LAB_002502e9;
    case 0x72:
      Pars.fLatchCorr = Pars.fLatchCorr ^ 1;
      goto LAB_002502e9;
    case 0x76:
      Pars.fVerboseFlops = Pars.fVerboseFlops ^ 1;
      goto LAB_002502e9;
    case 0x77:
      Pars.fUseSmartCnf = Pars.fUseSmartCnf ^ 1;
      goto LAB_002502e9;
    }
    globalUtilOptind = globalUtilOptind + 1;
    if (iVar1 < 0) {
LAB_00250619:
      Abc_Print(-2,"usage: &lcorr [-FCP num] [-rcvwh]\n");
      Abc_Print(-2,"\t         performs latch correpondence computation\n");
      Abc_Print(-2,"\t-C num : the max number of conflicts at a node [default = %d]\n",
                (ulong)(uint)Pars.nFrames);
      Abc_Print(-2,"\t-F num : the number of timeframes in inductive case [default = %d]\n",
                (ulong)(uint)Pars.nWords);
      Abc_Print(-2,"\t-P num : the number of timeframes in the prefix [default = %d]\n",
                (ulong)(uint)Pars.nRounds);
      pcVar3 = "no";
      if (Pars.fLatchCorr != 0) {
        pcVar3 = "yes";
      }
      Abc_Print(-2,"\t-r     : toggle using implication rings during refinement [default = %s]\n",
                pcVar3);
      pcVar3 = "no";
      if (Pars.fUseRings != 0) {
        pcVar3 = "yes";
      }
      Abc_Print(-2,"\t-c     : toggle using circuit-based SAT solver [default = %s]\n",pcVar3);
      pcVar3 = "no";
      if (Pars.fVerboseFlops != 0) {
        pcVar3 = "yes";
      }
      Abc_Print(-2,"\t-v     : toggle printing verbose information [default = %s]\n",pcVar3);
      pcVar3 = "no";
      if (Pars.fUseSmartCnf != 0) {
        pcVar3 = "yes";
      }
      Abc_Print(-2,"\t-w     : toggle printing verbose info about equivalent flops [default = %s]\n"
                ,pcVar3);
      Abc_Print(-2,"\t-h     : print the command usage\n");
      return 1;
    }
  } while( true );
}

Assistant:

int Abc_CommandAbc9Lcorr( Abc_Frame_t * pAbc, int argc, char ** argv )
{
    Cec_ParCor_t Pars, * pPars = &Pars;
    Gia_Man_t * pTemp;
    int c;
    Cec_ManCorSetDefaultParams( pPars );
    pPars->fLatchCorr = 1;
    Extra_UtilGetoptReset();
    while ( ( c = Extra_UtilGetopt( argc, argv, "FCPrcvwh" ) ) != EOF )
    {
        switch ( c )
        {
        case 'F':
            if ( globalUtilOptind >= argc )
            {
                Abc_Print( -1, "Command line switch \"-F\" should be followed by an integer.\n" );
                goto usage;
            }
            pPars->nFrames = atoi(argv[globalUtilOptind]);
            globalUtilOptind++;
            if ( pPars->nFrames < 0 )
                goto usage;
            break;
        case 'C':
            if ( globalUtilOptind >= argc )
            {
                Abc_Print( -1, "Command line switch \"-C\" should be followed by an integer.\n" );
                goto usage;
            }
            pPars->nBTLimit = atoi(argv[globalUtilOptind]);
            globalUtilOptind++;
            if ( pPars->nBTLimit < 0 )
                goto usage;
            break;
        case 'P':
            if ( globalUtilOptind >= argc )
            {
                Abc_Print( -1, "Command line switch \"-P\" should be followed by an integer.\n" );
                goto usage;
            }
            pPars->nPrefix = atoi(argv[globalUtilOptind]);
            globalUtilOptind++;
            if ( pPars->nPrefix < 0 )
                goto usage;
            break;
        case 'r':
            pPars->fUseRings ^= 1;
            break;
        case 'c':
            pPars->fUseCSat ^= 1;
            break;
        case 'v':
            pPars->fVerbose ^= 1;
            break;
        case 'w':
            pPars->fVerboseFlops ^= 1;
            break;
        default:
            goto usage;
        }
    }
    if ( pAbc->pGia == NULL )
    {
        Abc_Print( -1, "Abc_CommandAbc9Lcorr(): There is no AIG.\n" );
        return 1;
    }
    if ( Gia_ManBoxNum(pAbc->pGia) && Gia_ManRegBoxNum(pAbc->pGia) )
    {
        if ( pAbc->pGia->pAigExtra == NULL )
        {
            printf( "Timing manager is given but there is no GIA of boxes.\n" );
            return 0;
        }
        pTemp = Gia_ManSweepWithBoxes( pAbc->pGia, NULL, pPars, 0, 0, pPars->fVerbose, pPars->fVerboseFlops );
        Abc_FrameUpdateGia( pAbc, pTemp );
        return 0;
    }
    if ( Gia_ManRegNum(pAbc->pGia) == 0 )
    {
        Abc_Print( -1, "The network is combinational.\n" );
        return 0;
    }
    pTemp = Cec_ManLSCorrespondence( pAbc->pGia, pPars );
    Abc_FrameUpdateGia( pAbc, pTemp );
    return 0;

usage:
    Abc_Print( -2, "usage: &lcorr [-FCP num] [-rcvwh]\n" );
    Abc_Print( -2, "\t         performs latch correpondence computation\n" );
    Abc_Print( -2, "\t-C num : the max number of conflicts at a node [default = %d]\n", pPars->nBTLimit );
    Abc_Print( -2, "\t-F num : the number of timeframes in inductive case [default = %d]\n", pPars->nFrames );
    Abc_Print( -2, "\t-P num : the number of timeframes in the prefix [default = %d]\n", pPars->nPrefix );
    Abc_Print( -2, "\t-r     : toggle using implication rings during refinement [default = %s]\n", pPars->fUseRings? "yes": "no" );
    Abc_Print( -2, "\t-c     : toggle using circuit-based SAT solver [default = %s]\n", pPars->fUseCSat? "yes": "no" );
    Abc_Print( -2, "\t-v     : toggle printing verbose information [default = %s]\n", pPars->fVerbose? "yes": "no" );
    Abc_Print( -2, "\t-w     : toggle printing verbose info about equivalent flops [default = %s]\n", pPars->fVerboseFlops? "yes": "no" );
    Abc_Print( -2, "\t-h     : print the command usage\n");
    return 1;
}